

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_NtkCountObjBits(Wlc_Ntk_t *p,Vec_Int_t *vPisNew)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  undefined4 local_28;
  undefined4 local_24;
  int Count;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vPisNew_local;
  Wlc_Ntk_t *p_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_IntSize(vPisNew), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vPisNew,local_24);
    p_00 = Wlc_NtkObj(p,iVar1);
    iVar1 = Wlc_ObjRange(p_00);
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

int Wlc_NtkCountObjBits( Wlc_Ntk_t * p, Vec_Int_t * vPisNew )
{
    Wlc_Obj_t * pObj; 
    int i, Count = 0;
    Wlc_NtkForEachObjVec( vPisNew, p, pObj, i )
        Count += Wlc_ObjRange(pObj);
    return Count;
}